

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O1

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write_segment<char_const*>
          (writer_base<cppwinrt::writer> *this,string_view *value,char **first)

{
  char cVar1;
  char *pcVar2;
  size_type sVar3;
  size_t sVar4;
  ulong uVar5;
  string_view local_38;
  
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0,3);
  if (sVar3 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = const char *, Rest = <>]"
                 );
  }
  uVar5 = value->_M_len;
  if (sVar3 <= value->_M_len) {
    uVar5 = sVar3;
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&this->m_first,
             (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,value->_M_str,value->_M_str + uVar5);
  cVar1 = value->_M_str[sVar3];
  if (cVar1 == '%') {
    pcVar2 = *first;
    sVar4 = strlen(pcVar2);
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              ((vector<char,std::allocator<char>> *)&this->m_first,
               (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,pcVar2,pcVar2 + sVar4);
  }
  else {
    if (cVar1 == '^') {
      if (sVar3 == value->_M_len - 1) {
        __assert_fail("offset != value.size() - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                      ,0x12a,
                      "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = const char *, Rest = <>]"
                     );
      }
      write_impl(this,value->_M_str[sVar3 + 1]);
      uVar5 = sVar3 + 2;
      if (uVar5 <= value->_M_len) {
        local_38._M_str = value->_M_str + uVar5;
        local_38._M_len = value->_M_len - uVar5;
        write_segment<char_const*>(this,&local_38,first);
        return;
      }
      goto LAB_0016b9c7;
    }
    pcVar2 = *first;
    local_38._M_len = strlen(pcVar2);
    local_38._M_str = pcVar2;
    writer::write_code((writer *)this,&local_38);
  }
  uVar5 = sVar3 + 1;
  if (sVar3 < value->_M_len) {
    local_38._M_len = value->_M_len - uVar5;
    local_38._M_str = value->_M_str + uVar5;
    write_segment(this,&local_38);
    return;
  }
LAB_0016b9c7:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar5);
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }